

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Shifter.cpp
# Opt level: O1

void __thiscall Storage::Encodings::MFM::Shifter::add_input_bit(Shifter *this,int value)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  CCITT *pCVar4;
  ushort uVar5;
  
  uVar3 = this->bits_since_token_;
  uVar2 = this->shift_register_ * 2 | value;
  this->shift_register_ = uVar2;
  this->bits_since_token_ = uVar3 + 1;
  this->token_ = None;
  if (this->should_obey_syncs_ != true) goto LAB_00446762;
  if (this->is_mfm_ == false) {
    uVar2 = uVar2 & 0xffff;
    if (uVar2 < 0xf57e) {
      if (uVar2 == 0xf56a) {
        this->token_ = DeletedData;
        pCVar4 = this->crc_generator_;
        uVar5 = (pCVar4->
                super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                ).xor_table[7];
      }
      else {
        if (uVar2 != 0xf56f) goto LAB_00446758;
        this->token_ = Data;
        pCVar4 = this->crc_generator_;
        uVar5 = (pCVar4->
                super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
                ).xor_table[4];
      }
    }
    else if (uVar2 == 0xf57e) {
      this->token_ = ID;
      pCVar4 = this->crc_generator_;
      uVar5 = (pCVar4->
              super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
              ).xor_table[1];
    }
    else {
      if (uVar2 != 0xf77a) goto LAB_00446758;
      this->token_ = Index;
      pCVar4 = this->crc_generator_;
      uVar5 = (pCVar4->
              super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
              ).xor_table[3];
    }
    (pCVar4->super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
    ).value_ = uVar5 ^ 0xff00;
  }
  else {
    if ((uVar2 & 0xffff) == 0x4489) {
      this->bits_since_token_ = 0;
      this->is_awaiting_marker_value_ = true;
      (this->crc_generator_->
      super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>).
      value_ = 0xcdb4;
    }
    else {
      if ((uVar2 & 0xffff) != 0x5224) goto LAB_00446758;
      if ((uVar3 & 1) == 0) {
        this->shift_register_ = uVar2 >> 1;
      }
      this->bits_since_token_ = 0;
      this->is_awaiting_marker_value_ = true;
    }
    this->token_ = Sync;
  }
LAB_00446758:
  if (this->token_ != None) {
    this->bits_since_token_ = 0;
    return;
  }
LAB_00446762:
  if (this->bits_since_token_ == 0x10) {
    this->token_ = Byte;
    this->bits_since_token_ = 0;
    if ((this->is_awaiting_marker_value_ == true) && (this->is_mfm_ == true)) {
      this->is_awaiting_marker_value_ = false;
      uVar3 = (ushort)this->shift_register_ & 0x5555;
      uVar3 = (uVar3 >> 1 | uVar3) & 0x3333;
      uVar3 = (uVar3 >> 2 | uVar3) & 0xf0f;
      bVar1 = ((byte)(uVar3 >> 4) | (byte)uVar3) + 8;
      if ((bVar1 < 7) && ((0x59U >> (bVar1 & 0x1f) & 1) != 0)) {
        this->token_ = *(Token *)(&DAT_004e5c8c + (ulong)bVar1 * 4);
      }
    }
    pCVar4 = this->crc_generator_;
    uVar3 = (ushort)this->shift_register_ & 0x5555;
    uVar3 = (uVar3 >> 1 | uVar3) & 0x3333;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar5 = (pCVar4->
            super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>)
            .value_;
    (pCVar4->super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
    ).value_ = uVar5 << 8 ^
               (pCVar4->
               super_Generator<unsigned_short,_(unsigned_short)65535,_(unsigned_short)0,_false,_false>
               ).xor_table[(uVar3 & 0xf | uVar3 >> 4 & 0xf0) ^ (uint)(uVar5 >> 8)];
  }
  return;
}

Assistant:

void Shifter::add_input_bit(int value) {
	shift_register_ = (shift_register_ << 1) | unsigned(value);
	++bits_since_token_;

	token_ = Token::None;
	if(should_obey_syncs_) {
		if(!is_mfm_) {
			switch(shift_register_ & 0xffff) {
				case Storage::Encodings::MFM::FMIndexAddressMark:
					token_ = Token::Index;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::IndexAddressByte);
				break;
				case Storage::Encodings::MFM::FMIDAddressMark:
					token_ = Token::ID;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::IDAddressByte);
				break;
				case Storage::Encodings::MFM::FMDataAddressMark:
					token_ = Token::Data;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::DataAddressByte);
				break;
				case Storage::Encodings::MFM::FMDeletedDataAddressMark:
					token_ = Token::DeletedData;
					crc_generator_->reset();
					crc_generator_->add(Storage::Encodings::MFM::DeletedDataAddressByte);
				break;
				default:
				break;
			}
		} else {
			switch(shift_register_ & 0xffff) {
				case Storage::Encodings::MFM::MFMIndexSync:
					// This models a bit of slightly weird WD behaviour;
					// if an index sync was detected where it wasn't expected,
					// the WD will resync but also may return the clock bits
					// rather than data bits as the next byte read, depending
					// on framing.
					//
					// TODO: make this optional, if ever a Shifter with
					// well-defined non-WD behaviour is needed.
					//
					// TODO: Verify WD behaviour.
					if(bits_since_token_&1) {
						shift_register_ >>= 1;
					}

					bits_since_token_ = 0;
					is_awaiting_marker_value_ = true;

					token_ = Token::Sync;
				break;
				case Storage::Encodings::MFM::MFMSync:
					bits_since_token_ = 0;
					is_awaiting_marker_value_ = true;
					crc_generator_->set_value(Storage::Encodings::MFM::MFMPostSyncCRCValue);

					token_ = Token::Sync;
				break;
				default:
				break;
			}
		}

		if(token_ != Token::None) {
			bits_since_token_ = 0;
			return;
		}
	}

	if(bits_since_token_ == 16) {
		token_ = Token::Byte;
		bits_since_token_ = 0;

		if(is_awaiting_marker_value_ && is_mfm_) {
			is_awaiting_marker_value_ = false;
			switch(get_byte()) {
				case Storage::Encodings::MFM::IndexAddressByte:
					token_ = Token::Index;
				break;
				case Storage::Encodings::MFM::IDAddressByte:
					token_ = Token::ID;
				break;
				case Storage::Encodings::MFM::DataAddressByte:
					token_ = Token::Data;
				break;
				case Storage::Encodings::MFM::DeletedDataAddressByte:
					token_ = Token::DeletedData;
				break;
				default: break;
			}
		}

		crc_generator_->add(get_byte());
	}
}